

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

int amrex::parser_ast_depth(parser_node *node)

{
  initializer_list<int> __l;
  int iVar1;
  int *piVar2;
  char *__lhs;
  int *in_RDI;
  int d;
  int d3;
  int d2_2;
  int d1_2;
  int d2_1;
  int d1_1;
  int d2;
  int d1;
  string *in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [12];
  int in_stack_ffffffffffffff9c;
  int local_4c;
  int local_48;
  int local_44;
  int *local_40;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int local_4;
  
  __lhs = (char *)(ulong)(*in_RDI - 1);
  switch(__lhs) {
  case (char *)0x0:
  case (char *)0x1:
    local_4 = 1;
    break;
  case (char *)0x2:
  case (char *)0x3:
  case (char *)0x4:
  case (char *)0x5:
  case (char *)0xb:
    iVar1 = parser_ast_depth((parser_node *)
                             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    parser_ast_depth((parser_node *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    piVar2 = std::max<int>((int *)&stack0xffffffffffffffec,(int *)&stack0xffffffffffffffe8);
    local_4 = *piVar2 + 1;
    break;
  case (char *)0x6:
    local_4 = parser_ast_depth((parser_node *)
                               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    local_4 = local_4 + 1;
    break;
  case (char *)0x7:
    local_4 = parser_ast_depth((parser_node *)
                               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    local_4 = local_4 + 1;
    break;
  case (char *)0x8:
    local_1c = parser_ast_depth((parser_node *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    local_20 = parser_ast_depth((parser_node *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    piVar2 = std::max<int>(&local_1c,&local_20);
    local_4 = *piVar2 + 1;
    break;
  case (char *)0x9:
    local_24 = parser_ast_depth((parser_node *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    local_28 = parser_ast_depth((parser_node *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    local_44 = parser_ast_depth((parser_node *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    local_4c = local_24;
    local_48 = local_28;
    local_40 = &local_4c;
    local_38 = 3;
    __l._M_len = in_stack_ffffffffffffff50;
    __l._M_array = (iterator)in_stack_ffffffffffffff48;
    local_2c = local_44;
    local_4 = std::max<int>(__l);
    local_4 = local_4 + 1;
    break;
  case (char *)0xa:
    local_4 = parser_ast_depth((parser_node *)
                               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    local_4 = local_4 + 1;
    break;
  case (char *)0xc:
  case (char *)0xd:
  case (char *)0xe:
  case (char *)0xf:
  case (char *)0x10:
  case (char *)0x11:
  case (char *)0x12:
  case (char *)0x13:
  case (char *)0x14:
    local_4 = 1;
    break;
  default:
    __rhs = &local_90;
    std::__cxx11::to_string(in_stack_ffffffffffffff9c);
    std::operator+(__lhs,__rhs);
    Abort(in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&local_90);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
parser_ast_depth (struct parser_node* node)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
    case PARSER_SYMBOL:
        return 1;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_LIST:
    {
        int d1 = parser_ast_depth(node->l);
        int d2 = parser_ast_depth(node->r);
        return std::max(d1,d2)+1;
    }
    case PARSER_NEG:
        return parser_ast_depth(node->l)+1;
    case PARSER_F1:
        return parser_ast_depth(((struct parser_f1*)node)->l) + 1;
    case PARSER_F2:
    {
        int d1 = parser_ast_depth(((struct parser_f2*)node)->l);
        int d2 = parser_ast_depth(((struct parser_f2*)node)->r);
        return std::max(d1,d2)+1;
    }
    case PARSER_F3:
    {
        int d1 = parser_ast_depth(((struct parser_f3*)node)->n1);
        int d2 = parser_ast_depth(((struct parser_f3*)node)->n2);
        int d3 = parser_ast_depth(((struct parser_f3*)node)->n3);
        return std::max({d1,d2,d3})+1;
    }
    case PARSER_ASSIGN:
    {
        int d = parser_ast_depth(((struct parser_assign*)node)->v);
        return d+1;
    }
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
    case PARSER_NEG_P:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
        return 1;
    default:
        amrex::Abort("parser_ast_print: unknown node type " + std::to_string(node->type));
        return 0;
    }
}